

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::IFF_PDU::operator==(IFF_PDU *this,IFF_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_EmittingEntityID,&Value->m_EmittingEntityID), !KVar1)) &&
      (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar1))
     && (((KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Location,&Value->m_Location), !KVar1 &&
          (KVar1 = DATA_TYPE::SystemIdentifier::operator!=(&this->m_SystemID,&Value->m_SystemID),
          !KVar1)) &&
         (KVar1 = DATA_TYPE::FundamentalOperationalData::operator!=(&this->m_FOD,&Value->m_FOD),
         !KVar1)))) {
    bVar2 = std::operator!=(&this->m_vLayers,&Value->m_vLayers);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL IFF_PDU::operator == ( const IFF_PDU & Value ) const
{
    if( Header::operator    !=( Value ) )                 return false;
    if( m_EmittingEntityID  != Value.m_EmittingEntityID ) return false;
    if( m_EventID           != Value.m_EventID )          return false;
    if( m_Location          != Value.m_Location )         return false;
    if( m_SystemID          != Value.m_SystemID )         return false;
    if( m_FOD               != Value.m_FOD )              return false;
	if( m_vLayers           != Value.m_vLayers )          return false;
    return true;
}